

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O1

void __thiscall FOCC_OTA::garbageCollect(FOCC_OTA *this)

{
  _Base_ptr p_Var1;
  mapped_type pTVar2;
  pointer piVar3;
  _Rb_tree_node_base *p_Var4;
  char cVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  mapped_type *ppTVar8;
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  *this_00;
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_01;
  __node_base _Var9;
  pair<std::_Rb_tree_iterator<Transaction_*>,_std::_Rb_tree_iterator<Transaction_*>_> pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_Transaction_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_Transaction_*>_>_>
  pVar11;
  int e;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> freeables;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  _Rb_tree_node_base *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var7 = (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = p_Var6;
  if (p_Var7 != p_Var6) {
    do {
      local_70 = p_Var4;
      cVar5 = Transaction::getStatus((Transaction *)p_Var7[1]._M_parent);
      if (cVar5 != 's') {
        p_Var1 = p_Var7[1]._M_parent;
        for (p_Var6 = *(_Rb_tree_node_base **)(p_Var1 + 4);
            p_Var6 != (_Rb_tree_node_base *)&p_Var1[3]._M_left;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          this_01 = &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)p_Var6[1]._M_color]->read_list;
          pVar10 = std::
                   _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
                   ::equal_range(&this_01->_M_t,(key_type *)&p_Var7[1]._M_parent);
          std::
          _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
          ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar10.first._M_node,
                         (_Base_ptr)pVar10.second._M_node);
        }
        local_78 = &local_68;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_78,p_Var7 + 1,&local_78);
        p_Var6 = local_70;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      p_Var4 = local_70;
    } while (p_Var7 != p_Var6);
  }
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    this_00 = &this->transactions;
    _Var9._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_78 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)CONCAT44(local_78._4_4_,*(undefined4 *)&_Var9._M_nxt[1]._M_nxt);
      ppTVar8 = std::
                map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
                ::operator[](this_00,(key_type *)&local_78);
      pTVar2 = *ppTVar8;
      if (pTVar2 != (mapped_type)0x0) {
        piVar3 = (pTVar2->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar3 != (pointer)0x0) {
          operator_delete(piVar3,(long)(pTVar2->local_write_store).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar3);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&(pTVar2->readSet)._M_t);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&(pTVar2->writeSet)._M_t);
        operator_delete(pTVar2,0xc0);
      }
      pVar11 = std::
               _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)&local_78);
      std::
      _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node
                    );
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
    } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void FOCC_OTA::garbageCollect() {
    std::unordered_set<int> freeables{};

    for(auto& [k, v]: transactions){
        // dont need to process still ongoing transactions!
        if(v->getStatus()=='s') continue;

        // remove this transaction from any read_lists!
        for(auto i: v->readSet){
            dataItems[i]->read_list.erase(v);
        }

        // remove this transaction from the hashmap.
        //transactions.erase(k);
        freeables.insert(k);
    }

    for(auto e: freeables) {delete transactions[e];transactions.erase(e);}
}